

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::addToolBar
          (QMainWindowLayout *this,ToolBarArea area,QToolBar *toolbar,bool param_3)

{
  DockPosition pos;
  QLayoutItem *item;
  ToolBarArea area_00;
  
  if (area - LeftToolBarArea < 8) {
    area_00 = *(ToolBarArea *)(&DAT_0065eec0 + (ulong)(area - LeftToolBarArea) * 4);
  }
  else {
    area_00 = TopToolBarArea;
  }
  QLayout::addChildWidget((QLayout *)this,&toolbar->super_QWidget);
  pos = toDockPos(area_00);
  item = QToolBarAreaLayout::addToolBar((QToolBarAreaLayout *)(this + 0xa0),pos,toolbar);
  if (((item != (QLayoutItem *)0x0) && (*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8))) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QToolBarAreaLayout::insertItem((QToolBarAreaLayout *)(this + 0x3d8),pos,item);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  QToolBarPrivate::updateWindowFlags
            (*(QToolBarPrivate **)&(toolbar->super_QWidget).field_0x8,false,false);
  return;
}

Assistant:

void QMainWindowLayout::addToolBar(Qt::ToolBarArea area,
                                   QToolBar *toolbar,
                                   bool)
{
    area = validateToolBarArea(area);
    // let's add the toolbar to the layout
    addChildWidget(toolbar);
    QLayoutItem *item = layoutState.toolBarAreaLayout.addToolBar(toDockPos(area), toolbar);
    if (savedState.isValid() && item) {
        // copy the toolbar also in the saved state
        savedState.toolBarAreaLayout.insertItem(toDockPos(area), item);
    }
    invalidate();

    // this ensures that the toolbar has the right window flags (not floating any more)
    toolbar->d_func()->updateWindowFlags(false /*floating*/);
}